

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QShaderDescription::BlockVariable>::moveAppend
          (QGenericArrayOps<QShaderDescription::BlockVariable> *this,BlockVariable *b,
          BlockVariable *e)

{
  BlockVariable *pBVar1;
  Data *pDVar2;
  char *pcVar3;
  qsizetype qVar4;
  Data *pDVar5;
  int *piVar6;
  Data *pDVar7;
  BlockVariable *pBVar8;
  int iVar9;
  qsizetype qVar10;
  
  if ((b != e) && (b < e)) {
    pBVar1 = (this->super_QArrayDataPointer<QShaderDescription::BlockVariable>).ptr;
    qVar10 = (this->super_QArrayDataPointer<QShaderDescription::BlockVariable>).size;
    do {
      pDVar2 = (b->name).d.d;
      (b->name).d.d = (Data *)0x0;
      pBVar1[qVar10].name.d.d = pDVar2;
      pcVar3 = (b->name).d.ptr;
      (b->name).d.ptr = (char *)0x0;
      pBVar1[qVar10].name.d.ptr = pcVar3;
      qVar4 = (b->name).d.size;
      (b->name).d.size = 0;
      pBVar1[qVar10].name.d.size = qVar4;
      iVar9 = b->offset;
      pBVar1[qVar10].type = b->type;
      pBVar1[qVar10].offset = iVar9;
      pBVar1[qVar10].size = b->size;
      pDVar5 = (b->arrayDims).d.d;
      (b->arrayDims).d.d = (Data *)0x0;
      pBVar1[qVar10].arrayDims.d.d = pDVar5;
      piVar6 = (b->arrayDims).d.ptr;
      (b->arrayDims).d.ptr = (int *)0x0;
      pBVar1[qVar10].arrayDims.d.ptr = piVar6;
      qVar4 = (b->arrayDims).d.size;
      (b->arrayDims).d.size = 0;
      pBVar1[qVar10].arrayDims.d.size = qVar4;
      iVar9 = b->matrixStride;
      pBVar1[qVar10].arrayStride = b->arrayStride;
      pBVar1[qVar10].matrixStride = iVar9;
      pBVar1[qVar10].matrixIsRowMajor = b->matrixIsRowMajor;
      pDVar7 = (b->structMembers).d.d;
      (b->structMembers).d.d = (Data *)0x0;
      pBVar1[qVar10].structMembers.d.d = pDVar7;
      pBVar8 = (b->structMembers).d.ptr;
      (b->structMembers).d.ptr = (BlockVariable *)0x0;
      pBVar1[qVar10].structMembers.d.ptr = pBVar8;
      qVar4 = (b->structMembers).d.size;
      (b->structMembers).d.size = 0;
      pBVar1[qVar10].structMembers.d.size = qVar4;
      b = b + 1;
      qVar10 = (this->super_QArrayDataPointer<QShaderDescription::BlockVariable>).size + 1;
      (this->super_QArrayDataPointer<QShaderDescription::BlockVariable>).size = qVar10;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }